

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fxch.c
# Opt level: O3

void Fxch_CubesUnGruping(Fxch_Man_t *pFxchMan)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  Vec_Wec_t *pVVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  
  pVVar12 = pFxchMan->vCubes;
  uVar11 = (ulong)(uint)pFxchMan->nSizeOutputID;
  if (pVVar12->nSize != pFxchMan->vOutputID->nSize / pFxchMan->nSizeOutputID) {
    __assert_fail("Vec_WecSize( pFxchMan->vCubes ) == ( Vec_IntSize( pFxchMan->vOutputID ) / pFxchMan->nSizeOutputID )"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxch/Fxch.c"
                  ,0x71,"void Fxch_CubesUnGruping(Fxch_Man_t *)");
  }
  if (0 < pVVar12->nSize) {
    lVar16 = 0;
    do {
      pVVar1 = pVVar12->pArray;
      if (pVVar1[lVar16].nSize != 0) {
        if (pVVar1[lVar16].nSize < 1) {
LAB_004bdd44:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (*pVVar1[lVar16].pArray == 0) {
          iVar7 = (int)uVar11;
          uVar3 = iVar7 * (int)lVar16;
          if (((int)uVar3 < 0) || (pFxchMan->vOutputID->nSize <= (int)uVar3)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          if (0 < iVar7) {
            piVar2 = pFxchMan->vOutputID->pArray;
            uVar13 = 0;
            iVar15 = 0;
            do {
              uVar14 = piVar2[(uint)((int)lVar16 * iVar7) + uVar13];
              uVar14 = (uVar14 >> 1 & 0x55555555) + (uVar14 & 0x55555555);
              uVar14 = (uVar14 >> 2 & 0x33333333) + (uVar14 & 0x33333333);
              uVar14 = (uVar14 >> 4 & 0x7070707) + (uVar14 & 0x7070707);
              uVar14 = (uVar14 >> 8 & 0xf000f) + (uVar14 & 0xf000f);
              iVar15 = iVar15 + (uVar14 >> 0x10) + (uVar14 & 0xffff);
              uVar13 = uVar13 + 1;
            } while ((uVar11 & 0xffffffff) != uVar13);
            if ((0 < iVar7) && (iVar15 != 0)) {
              lVar9 = 0;
              do {
                uVar14 = (int)lVar9 << 5;
                uVar11 = 0;
                do {
                  if (((uint)piVar2[(ulong)uVar3 + lVar9] >> ((uint)uVar11 & 0x1f) & 1) != 0) {
                    if (iVar15 == 1) {
                      if ((int)uVar14 < 0) goto LAB_004bdd44;
                      uVar13 = uVar11 | uVar14;
                      if (pFxchMan->vTranslation->nSize <= (int)uVar13) goto LAB_004bdd44;
                      if (pVVar1[lVar16].nSize < 1) {
LAB_004bdd63:
                        __assert_fail("i >= 0 && i < p->nSize",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
                      }
                      piVar6 = pFxchMan->vTranslation->pArray + uVar13;
                      pVVar5 = pVVar1 + lVar16;
                    }
                    else {
                      pVVar12 = pFxchMan->vCubes;
                      uVar10 = pVVar12->nSize;
                      if (uVar10 == pVVar12->nCap) {
                        if ((int)uVar10 < 0x10) {
                          if (pVVar12->pArray == (Vec_Int_t *)0x0) {
                            pVVar5 = (Vec_Int_t *)malloc(0x100);
                          }
                          else {
                            pVVar5 = (Vec_Int_t *)realloc(pVVar12->pArray,0x100);
                            uVar10 = pVVar12->nCap;
                          }
                          pVVar12->pArray = pVVar5;
                          iVar8 = 0x10 - uVar10;
                          pVVar5 = pVVar5 + (int)uVar10;
                          iVar7 = 0x10;
                        }
                        else {
                          if (pVVar12->pArray == (Vec_Int_t *)0x0) {
                            pVVar5 = (Vec_Int_t *)malloc((ulong)uVar10 << 5);
                            uVar4 = uVar10;
                          }
                          else {
                            pVVar5 = (Vec_Int_t *)realloc(pVVar12->pArray,(ulong)uVar10 << 5);
                            uVar4 = pVVar12->nCap;
                          }
                          iVar7 = uVar10 * 2;
                          pVVar12->pArray = pVVar5;
                          iVar8 = iVar7 - uVar4;
                          pVVar5 = pVVar5 + (int)uVar4;
                        }
                        memset(pVVar5,0,(long)iVar8 << 4);
                        pVVar12->nCap = iVar7;
                        uVar10 = pVVar12->nSize;
                      }
                      uVar4 = uVar10 + 1;
                      pVVar12->nSize = uVar4;
                      if ((int)uVar10 < 0) {
                        __assert_fail("p->nSize > 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                                      ,0xa1,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
                      }
                      pVVar5 = pVVar12->pArray;
                      if (0 < pVVar1[lVar16].nSize) {
                        lVar17 = 0;
                        do {
                          Vec_IntPush(pVVar5 + ((ulong)uVar4 - 1),pVVar1[lVar16].pArray[lVar17]);
                          lVar17 = lVar17 + 1;
                        } while (lVar17 < pVVar1[lVar16].nSize);
                      }
                      if ((int)uVar14 < 0) goto LAB_004bdd44;
                      uVar13 = uVar11 | uVar14;
                      if (pFxchMan->vTranslation->nSize <= (int)uVar13) goto LAB_004bdd44;
                      if (pVVar5[(ulong)uVar4 - 1].nSize < 1) goto LAB_004bdd63;
                      piVar6 = pFxchMan->vTranslation->pArray + uVar13;
                      pVVar5 = pVVar5 + ((ulong)uVar4 - 1);
                    }
                    *pVVar5->pArray = *piVar6;
                    iVar15 = iVar15 + -1;
                  }
                } while ((uVar11 < 0x1f) && (uVar11 = uVar11 + 1, iVar15 != 0));
                lVar9 = lVar9 + 1;
                uVar11 = (ulong)pFxchMan->nSizeOutputID;
              } while ((lVar9 < (long)uVar11) && (iVar15 != 0));
              pVVar12 = pFxchMan->vCubes;
            }
          }
        }
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < pVVar12->nSize);
  }
  pVVar1 = pFxchMan->vTranslation;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = pFxchMan->vOutputID;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  if (pFxchMan->pTempOutputID != (int *)0x0) {
    free(pFxchMan->pTempOutputID);
    pFxchMan->pTempOutputID = (int *)0x0;
  }
  return;
}

Assistant:

void Fxch_CubesUnGruping(Fxch_Man_t* pFxchMan)
{
    int iCube;
    int i, j;
    Vec_Int_t* vCube;
    Vec_Int_t* vNewCube;

    assert( Vec_WecSize( pFxchMan->vCubes ) == ( Vec_IntSize( pFxchMan->vOutputID ) / pFxchMan->nSizeOutputID ) );
    Vec_WecForEachLevel( pFxchMan->vCubes, vCube, iCube )
    {
        int * pOutputID, nOnes;
        if ( Vec_IntSize( vCube ) == 0 || Vec_IntEntry( vCube, 0 ) != 0 )
            continue;

        pOutputID = Vec_IntEntryP( pFxchMan->vOutputID, iCube * pFxchMan->nSizeOutputID );
        nOnes = 0;

        for ( i = 0; i < pFxchMan->nSizeOutputID; i++ )
            nOnes += Fxch_CountOnes( (unsigned int) pOutputID[i] );

        for ( i = 0; i < pFxchMan->nSizeOutputID && nOnes; i++ )
            for ( j = 0; j < 32 && nOnes; j++ )
                if ( pOutputID[i] & ( 1 << j ) )
                {
                    if ( nOnes == 1 )
                        Vec_IntWriteEntry( vCube, 0, Vec_IntEntry( pFxchMan->vTranslation, ( i << 5 ) | j ) );
                    else
                    {
                        vNewCube = Vec_WecPushLevel( pFxchMan->vCubes );
                        Vec_IntAppend( vNewCube, vCube );
                        Vec_IntWriteEntry( vNewCube, 0, Vec_IntEntry( pFxchMan->vTranslation, (i << 5 ) | j ) );
                    }
                    nOnes -= 1;
                }
    }

    Vec_IntFree( pFxchMan->vTranslation );
    Vec_IntFree( pFxchMan->vOutputID );
    ABC_FREE( pFxchMan->pTempOutputID );
    return;
}